

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O0

int chacha20_poly1305_open_gather
              (uint8_t *key,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len,size_t tag_len)

{
  int iVar1;
  undefined1 local_78 [8];
  chacha20_poly1305_open_data data;
  uint64_t in_len_64;
  size_t in_len_local;
  uint8_t *in_local;
  size_t nonce_len_local;
  uint8_t *nonce_local;
  uint8_t *out_local;
  uint8_t *key_local;
  
  in_len_64 = in_len;
  in_len_local = (size_t)in;
  in_local = (uint8_t *)nonce_len;
  nonce_len_local = (size_t)nonce;
  nonce_local = out;
  out_local = key;
  if (nonce_len == 0xc) {
    if (in_tag_len == tag_len) {
      data._40_8_ = in_len;
      if (in_len < 0x3fffffffc0) {
        iVar1 = chacha20_poly1305_asm_capable();
        if (iVar1 == 0) {
          calc_tag(local_78,out_local,(uint8_t *)nonce_len_local,ad,ad_len,(uint8_t *)in_len_local,
                   in_len_64,(uint8_t *)0x0,0);
          CRYPTO_chacha_20(nonce_local,(uint8_t *)in_len_local,in_len_64,out_local,
                           (uint8_t *)nonce_len_local,1);
        }
        else {
          OPENSSL_memcpy(local_78,out_local,0x20);
          data._24_4_ = 0;
          OPENSSL_memcpy(data.in.key + 0x1c,(void *)nonce_len_local,0xc);
          chacha20_poly1305_open
                    (nonce_local,(uint8_t *)in_len_local,in_len_64,ad,ad_len,
                     (chacha20_poly1305_open_data *)local_78);
        }
        iVar1 = CRYPTO_memcmp(local_78,in_tag,tag_len);
        if (iVar1 == 0) {
          key_local._4_4_ = 1;
        }
        else {
          ERR_put_error(0x1e,0,0x65,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                        ,0x103);
          key_local._4_4_ = 0;
        }
      }
      else {
        ERR_put_error(0x1e,0,0x75,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                      ,0xf3);
        key_local._4_4_ = 0;
      }
    }
    else {
      ERR_put_error(0x1e,0,0x65,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                    ,0xe7);
      key_local._4_4_ = 0;
    }
  }
  else {
    ERR_put_error(0x1e,0,0x79,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0xe2);
    key_local._4_4_ = 0;
  }
  return key_local._4_4_;
}

Assistant:

static int chacha20_poly1305_open_gather(
    const uint8_t *key, uint8_t *out, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *in_tag,
    size_t in_tag_len, const uint8_t *ad, size_t ad_len, size_t tag_len) {
  if (nonce_len != 12) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  if (in_tag_len != tag_len) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  // |CRYPTO_chacha_20| uses a 32-bit block counter. Therefore we disallow
  // individual operations that work on more than 256GB at a time.
  // |in_len_64| is needed because, on 32-bit platforms, size_t is only
  // 32-bits and this produces a warning because it's always false.
  // Casting to uint64_t inside the conditional is not sufficient to stop
  // the warning.
  const uint64_t in_len_64 = in_len;
  if (in_len_64 >= (UINT64_C(1) << 32) * 64 - 64) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_TOO_LARGE);
    return 0;
  }

  union chacha20_poly1305_open_data data;
  if (chacha20_poly1305_asm_capable()) {
    OPENSSL_memcpy(data.in.key, key, 32);
    data.in.counter = 0;
    OPENSSL_memcpy(data.in.nonce, nonce, 12);
    chacha20_poly1305_open(out, in, in_len, ad, ad_len, &data);
  } else {
    calc_tag(data.out.tag, key, nonce, ad, ad_len, in, in_len, NULL, 0);
    CRYPTO_chacha_20(out, in, in_len, key, nonce, 1);
  }

  if (CRYPTO_memcmp(data.out.tag, in_tag, tag_len) != 0) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_DECRYPT);
    return 0;
  }

  return 1;
}